

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulator.c
# Opt level: O3

int poly_compute_vertex_attributes
              (_AL_LIST *vertices,_AL_LIST_ITEM *item,int flags,_AL_LIST *reflex)

{
  _Bool _Var1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  float *v0;
  float *v1;
  float *v2;
  long lVar6;
  long lVar7;
  float *point;
  uint uVar8;
  
  uVar3 = _al_list_previous_circular();
  uVar4 = _al_list_next_circular(vertices,item);
  uVar5 = _al_list_size(vertices);
  uVar8 = 0;
  if (2 < uVar5) {
    v0 = (float *)_al_list_item_data(uVar3);
    v1 = (float *)_al_list_item_data(item);
    v2 = (float *)_al_list_item_data(uVar4);
    if (0.0 <= (v2[1] - v1[1]) * (*v0 - *v1) - (*v2 - *v1) * (v0[1] - v1[1])) {
      if ((flags & 2U) == 0) {
        uVar8 = 0;
      }
      else {
        if (reflex == (_AL_LIST *)0x0) {
          lVar6 = _al_list_size(vertices);
          lVar6 = lVar6 + -3;
          lVar7 = _al_list_next_circular(vertices,uVar4);
        }
        else {
          lVar6 = _al_list_size(reflex);
          lVar7 = _al_list_front(reflex);
          vertices = reflex;
        }
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          point = (float *)_al_list_item_data(lVar7);
          if (vertices == reflex) {
            point = (float *)_al_list_item_data(point);
          }
          if ((((point != v2) && (point != v0)) && (point != v1)) &&
             (_Var1 = _al_prim_is_point_in_triangle(point,v0,v1,v2), _Var1)) {
            lVar7 = 0;
            break;
          }
          lVar7 = _al_list_next_circular(vertices,lVar7);
        }
        uVar8 = 0;
        if ((lVar7 != 0) || (cVar2 = _al_list_is_empty(vertices), cVar2 != '\0')) {
          uVar8 = 2;
        }
      }
    }
    else {
      uVar8 = flags & 1;
    }
  }
  return uVar8;
}

Assistant:

static int poly_compute_vertex_attributes(_AL_LIST* vertices, _AL_LIST_ITEM* item, int flags, _AL_LIST* reflex)
{
   size_t i;
   _AL_LIST_ITEM* prev = _al_list_previous_circular(vertices, item);
   _AL_LIST_ITEM* next = _al_list_next_circular(vertices, item);
   _AL_LIST_ITEM* point = NULL;
   int result = 0;
   float* v0;
   float* v1;
   float* v2;
   float cross;

   // Oops, degenerate triangle in store.
   if (_al_list_size(vertices) < 3)
      return result;

   // Get points.
   v0 = (float*)_al_list_item_data(prev);
   v1 = (float*)_al_list_item_data(item);
   v2 = (float*)_al_list_item_data(next);

   // Compute the cross product between the two edges
   cross = (v0[0] - v1[0]) * (v2[1] - v1[1]) - (v0[1] - v1[1]) * (v2[0] - v1[0]);

# if POLY_DEBUG
   if (g_poly_debug_step == g_poly_debug_step_current) {

      float step = 0.25f * 0.0f;

      float dir0[2] = { v0[0] - v1[0], v0[1] - v1[1] };
      float dir2[2] = { v2[0] - v1[0], v2[1] - v1[1] };

      POLY_DEBUG_TEXT(v1[0], v1[1], "%d", cross > 0);

      al_draw_line(v1[0], v1[1], v1[0] + dir0[0] * step, v1[1] + dir0[1] * step, al_map_rgb(255, 0, 0), 4.0f * g_poly_debug_scale);
      al_draw_line(v1[0], v1[1], v1[0] + dir2[0] * step, v1[1] + dir2[1] * step, al_map_rgb(255, 0, 0), 4.0f * g_poly_debug_scale);
   }
# endif

   // If internal angle is less than 180 degrees then we may
   // have an ear clip vertex, otherwise we have reflex.
   if (cross >= 0)
   {
      if (flags & POLY_VERTEX_ATTR_EAR_CLIP)
      {
         _AL_LIST_ITEM* start;
         _AL_LIST* search_list;
         size_t size;

         if (reflex) {

            search_list = reflex;
            size        = _al_list_size(search_list);
            start       = _al_list_front(reflex);
         }
         else {
            search_list = vertices;
            size        = _al_list_size(search_list) - 3;
            start       = _al_list_next_circular(search_list, next);
         }

         // Check for ear vertex.
         point = start;
         for (i = 0; i < size; ++i, point = _al_list_next_circular(search_list, point)) {

            float* v;

            // TODO: optimize this by removing if
            if (search_list == reflex)
               v = (float*)_al_list_item_data((_AL_LIST_ITEM*)_al_list_item_data(point));
            else
               v = (float*)_al_list_item_data(point);

            // Ignore vertices which belong to the triangle.
            if ((v == v0) || (v == v1) || (v == v2))
               continue;

            // Set point to NULL if we find any point inside the triangle.
            if (_al_prim_is_point_in_triangle(v, v0, v1, v2)) {
               point = NULL;
               break;
            }
         }

         // If point is not NULL, we have ear vertex.
         if ((NULL != point) || _al_list_is_empty(search_list))
            result |= POLY_VERTEX_ATTR_EAR_CLIP;
      }
   }
   else if (flags & POLY_VERTEX_ATTR_REFLEX)
      result |= POLY_VERTEX_ATTR_REFLEX;

   return result;
}